

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
fasttext::Model::computeHidden(Model *this,vector<int,_std::allocator<int>_> *input,Vector *hidden)

{
  int64_t iVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  
  iVar1 = Vector::size(hidden);
  if (iVar1 != this->hsz_) {
    __assert_fail("hidden.size() == hsz_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                  ,0x6b,
                  "void fasttext::Model::computeHidden(const std::vector<int32_t> &, Vector &) const"
                 );
  }
  Vector::zero(hidden);
  auVar4 = in_ZMM0._0_16_;
  piVar2 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = piVar2;
  if (piVar2 != (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      Vector::addRow(hidden,(this->wi_).
                            super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)*piVar3);
      auVar4 = in_ZMM0._0_16_;
      piVar3 = piVar3 + 1;
    } while (piVar3 != (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
    piVar2 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  }
  auVar4 = vcvtusi2sd_avx512f(auVar4,(long)piVar3 - (long)piVar2 >> 2);
  Vector::mul(hidden,(float)(1.0 / auVar4._0_8_));
  return;
}

Assistant:

void Model::computeHidden(const std::vector<int32_t>& input, Vector& hidden) const {
  assert(hidden.size() == hsz_);
  hidden.zero();
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    hidden.addRow(*wi_, *it);
  }
  hidden.mul(1.0 / input.size());
}